

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exepath.cpp
# Opt level: O0

string * fs_exe_path_abi_cxx11_(void)

{
  size_t __n;
  char *__buf;
  size_type __len;
  ssize_t sVar1;
  string *in_RDI;
  ssize_t M;
  size_type L;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string path;
  
  __n = fs_get_max_path();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,__n,'\0',&local_31);
  std::allocator<char>::~allocator(&local_31);
  M = 0;
  __buf = (char *)std::__cxx11::string::data();
  __len = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  sVar1 = readlink("/proc/self/exe",__buf,__len);
  if (0 < sVar1) {
    M = sVar1;
  }
  if (M == 0) {
    fs_print_error("","fs_exe_path");
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::__cxx11::string::resize((ulong)local_30);
    std::__cxx11::string::string((string *)in_RDI,(string *)local_30);
  }
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

std::string fs_exe_path()
{
  // https://stackoverflow.com/a/4031835
  // https://stackoverflow.com/a/1024937

  std::string path(fs_get_max_path(), '\0');
  std::string::size_type L = 0;

#if defined(_WIN32) || defined(__CYGWIN__)
  // https://learn.microsoft.com/en-us/windows/win32/api/libloaderapi/nf-libloaderapi-getmodulefilenamea
  if (DWORD M = GetModuleFileNameA(nullptr, path.data(), static_cast<DWORD>(path.size()));
        M > 0 && GetLastError() != ERROR_INSUFFICIENT_BUFFER) FFS_LIKELY
    L = static_cast<std::size_t>(M);
#elif defined(__linux__)
  // https://man7.org/linux/man-pages/man2/readlink.2.html
  if(ssize_t M = readlink("/proc/self/exe", path.data(), path.size()); M > 0)  FFS_LIKELY
    L = static_cast<std::size_t>(M);
#elif defined(__APPLE__) && defined(__MACH__)
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man3/dyld.3.html
  // get buffer size first. Need mp=0 to avoid intermittent segfault.
  if(std::uint32_t mp = 0;
      _NSGetExecutablePath(nullptr, &mp) == -1 &&
      _NSGetExecutablePath(path.data(), &mp) == 0)  FFS_LIKELY
      L = static_cast<std::size_t>(mp-1);
#elif defined(BSD)
  // https://man.freebsd.org/cgi/man.cgi?sysctl(3)
  std::size_t M = path.size();
  const int mib[4] = {CTL_KERN, KERN_PROC, KERN_PROC_PATHNAME, -1};
  if(sysctl(mib, 4, path.data(), &M, nullptr, 0) == 0)  FFS_LIKELY
    L = M;
#endif

  if(L > 0)  FFS_LIKELY
  {
    path.resize(L);
    return path;
  }